

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::
Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
          (Printer *this,string_view text,char (*args) [5],
          basic_string_view<char,_std::char_traits<char>_> *args_1,char (*args_2) [17],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  ulong uVar1;
  basic_string_view<char,_std::char_traits<char>_> *key;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  map;
  string_view vars [7];
  undefined8 *local_f0;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_e8;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_e0;
  undefined1 local_d8 [32];
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  size_t local_a8;
  char *pcStack_a0;
  size_t local_98;
  char (*local_90) [17];
  size_type local_88;
  pointer local_80;
  size_t local_78;
  char (*local_70) [15];
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_b8._M_len = strlen(*args);
  local_a8 = args_1->_M_len;
  pcStack_a0 = args_1->_M_str;
  local_b8._M_str = *args;
  local_98 = strlen(*args_2);
  local_80 = (args_3->_M_dataplus)._M_p;
  local_88 = args_3->_M_string_length;
  local_90 = args_2;
  local_78 = strlen(*args_4);
  local_70 = args_4;
  local_60 = (args_5->_M_dataplus)._M_p;
  local_68 = args_5->_M_string_length;
  local_58 = 0;
  local_50 = "";
  local_d8._0_8_ = 0;
  local_d8._8_8_ = 0;
  local_d8._16_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::reserve((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)local_d8,3);
  uVar1 = 0xfffffffffffffffe;
  key = &local_b8;
  do {
    local_e0._M_head_impl = key + 1;
    local_f0 = (undefined8 *)local_d8;
    local_e8._M_head_impl = key;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>
    ::EmplaceDecomposable::operator()
              (&local_48,&local_f0,key,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *)&local_e8,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *)&local_e0);
    uVar1 = uVar1 + 2;
    key = key + 2;
  } while (uVar1 < 4);
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>>
            (this,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)local_d8,text);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)local_d8);
  return;
}

Assistant:

void Printer::Print(absl::string_view text, const Args&... args) {
  static_assert(sizeof...(args) % 2 == 0, "");

  // Include an extra arg, since a zero-length array is ill-formed, and
  // MSVC complains.
  absl::string_view vars[] = {args..., ""};
  absl::flat_hash_map<absl::string_view, absl::string_view> map;
  map.reserve(sizeof...(args) / 2);
  for (size_t i = 0; i < sizeof...(args); i += 2) {
    map.emplace(vars[i], vars[i + 1]);
  }

  Print(map, text);
}